

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin_kmp.cpp
# Opt level: O2

void __thiscall
flatbuffers::kotlin::KotlinKMPGenerator::GenerateAddField
          (KotlinKMPGenerator *this,string *field_pos,FieldDef *field,CodeWriter *writer,
          IDLOptions *options)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params;
  string signature;
  anon_class_32_4_43b17e1f content;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> secondArg;
  string field_type;
  allocator<char> local_119;
  IDLOptions *local_118;
  string local_110;
  function<void_()> local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 local_90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  local_118 = options;
  GenType_abi_cxx11_(&local_50,this,&(field->value).type);
  (*(this->namer_).super_Namer._vptr_Namer[0x14])
            (&local_b0,&this->namer_,field,(ulong)(this->namer_).super_Namer.config_.variables);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                 &local_b0,": ");
  std::operator+(&local_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                 &local_50);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  local_90._0_8_ = field;
  local_90._8_8_ = this;
  local_90._16_8_ = writer;
  local_90._24_8_ = field_pos;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"add",(allocator<char> *)&local_f0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"",&local_119);
  IdlNamer::LegacyKotlinMethod(&local_b0,&this->namer_,&local_d0,field,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_d0);
  std::operator+(&local_d0,"builder: FlatBufferBuilder, ",&local_70);
  if (field->key == true) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"",&local_119);
    std::function<void()>::
    function<flatbuffers::kotlin::KotlinKMPGenerator::GenerateAddField(std::__cxx11::string,flatbuffers::FieldDef&,flatbuffers::CodeWriter&,flatbuffers::IDLOptions)const::_lambda()_1_&,void>
              ((function<void()> *)&local_f0,(anon_class_32_4_43b17e1f *)local_90);
    GenerateFun(writer,&local_b0,&local_d0,&local_110,&local_f0,local_118->gen_jvmstatic);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"",&local_119);
    std::function<void()>::
    function<flatbuffers::kotlin::KotlinKMPGenerator::GenerateAddField(std::__cxx11::string,flatbuffers::FieldDef&,flatbuffers::CodeWriter&,flatbuffers::IDLOptions)const::_lambda()_1_&,void>
              ((function<void()> *)&local_f0,(anon_class_32_4_43b17e1f *)local_90);
    GenerateFunOneLine(writer,&local_b0,&local_d0,&local_110,&local_f0,local_118->gen_jvmstatic);
  }
  std::_Function_base::~_Function_base(&local_f0.super__Function_base);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void GenerateAddField(std::string field_pos, FieldDef &field,
                        CodeWriter &writer, const IDLOptions options) const {
    auto field_type = GenType(field.value.type);
    auto secondArg = namer_.Variable(field.name) + ": " + field_type;

    auto content = [&]() {
      auto method = GenMethod(field.value.type);
      auto default_value = GenDefaultBufferValue(field);
      auto field_param = namer_.Field(field);
      if (IsEnum(field.value.type) || IsStruct(field.value.type)) {
        field_param += ".value";
      }

      writer.SetValue("field_name", namer_.Field(field));
      writer.SetValue("field_param", field_param);
      writer.SetValue("method_name", method);
      writer.SetValue("pos", field_pos);
      writer.SetValue("default", default_value);

      if (field.key) {
        // field has key attribute, so always need to exist
        // even if its value is equal to default.
        // Generated code will bypass default checking
        // resulting in { builder.addShort(name); slot(id); }
        writer += "builder.add{{method_name}}({{field_name}})";
        writer += "builder.slot({{pos}})";
      } else {
        writer += "builder.add{{method_name}}({{pos}}, \\";
        writer += "{{field_param}}, {{default}})";
      }
    };
    auto signature = namer_.LegacyKotlinMethod("add", field, "");
    auto params = "builder: FlatBufferBuilder, " + secondArg;
    if (field.key) {
      GenerateFun(writer, signature, params, "", content,
                  options.gen_jvmstatic);
    } else {
      GenerateFunOneLine(writer, signature, params, "", content,
                         options.gen_jvmstatic);
    }
  }